

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Namespace *n)

{
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  *pvVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  Function *f_00;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> structs;
  pool_ref<soul::AST::Function> *f;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  
  pvVar1 = &(n->super_ModuleBase).structures;
  structs.s = (pvVar1->
              super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  structs.e = (pvVar1->
              super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  generateStructs(this,structs);
  ppVar2 = (n->functions).
           super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = (n->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2; ppVar7 = ppVar7 + 1) {
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[5])(this,ppVar7->object);
  }
  ppVar3 = (n->super_ModuleBase).structures.
           super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (n->super_ModuleBase).structures.
                super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar3; ppVar5 = ppVar5 + 1) {
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,ppVar5->object);
  }
  ppVar4 = (n->super_ModuleBase).usings.
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (n->super_ModuleBase).usings.
                super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar4; ppVar6 = ppVar6 + 1) {
    (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,ppVar6->object);
  }
  ppVar2 = (n->functions).
           super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = (n->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2; ppVar7 = ppVar7 + 1) {
    f_00 = ppVar7->object;
    if ((f_00->genericWildcards).
        super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (f_00->genericWildcards).
        super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      generateFunction(this,f_00);
    }
  }
  return;
}

Assistant:

void visit (AST::Namespace& n) override
    {
        generateStructs (n.structures);
        for (auto& f : n.functions)   visitObject (f);
        for (auto& s : n.structures)  visitObject (s);
        for (auto& u : n.usings)      visitObject (u);

        generateFunctions (n.functions);
    }